

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O3

Point2f pbrt::WrapEqualAreaSquare(Point2f uv)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Tuple2<pbrt::Point2,_float> TVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar6 [64];
  
  auVar6._8_56_ = in_register_00001208;
  auVar6._0_8_ = uv.super_Tuple2<pbrt::Point2,_float>;
  auVar4 = auVar6._0_16_;
  if (0.0 <= uv.super_Tuple2<pbrt::Point2,_float>.x) {
    if (1.0 < uv.super_Tuple2<pbrt::Point2,_float>.x) {
      auVar4 = vsubps_avx(ZEXT816(0x3f80000040000000),auVar4);
    }
  }
  else {
    auVar2._8_4_ = 0x80000000;
    auVar2._0_8_ = 0x8000000080000000;
    auVar2._12_4_ = 0x80000000;
    auVar2 = vxorps_avx512vl(auVar4,auVar2);
    auVar4 = vmovshdup_avx(auVar4);
    auVar4 = vinsertps_avx(auVar2,ZEXT416((uint)(1.0 - auVar4._0_4_)),0x1c);
  }
  TVar3 = auVar4._0_8_;
  auVar2 = vmovshdup_avx(auVar4);
  if (auVar2._0_4_ < 0.0) {
    auVar1._8_4_ = 0x80000000;
    auVar1._0_8_ = 0x8000000080000000;
    auVar1._12_4_ = 0x80000000;
    auVar2 = vxorps_avx512vl(auVar4,auVar1);
    auVar5._4_12_ = auVar2._4_12_;
    auVar5._0_4_ = 1.0 - auVar4._0_4_;
    return (Point2f)auVar5._0_8_;
  }
  if (1.0 < auVar2._0_4_) {
    auVar4 = vsubps_avx(ZEXT816(0x400000003f800000),auVar4);
    TVar3 = auVar4._0_8_;
  }
  return (Point2f)TVar3;
}

Assistant:

Point2f WrapEqualAreaSquare(Point2f uv) {
    if (uv[0] < 0) {
        uv[0] = -uv[0];     // mirror across u = 0
        uv[1] = 1 - uv[1];  // mirror across v = 0.5
    } else if (uv[0] > 1) {
        uv[0] = 2 - uv[0];  // mirror across u = 1
        uv[1] = 1 - uv[1];  // mirror across v = 0.5
    }
    if (uv[1] < 0) {
        uv[0] = 1 - uv[0];  // mirror across u = 0.5
        uv[1] = -uv[1];     // mirror across v = 0;
    } else if (uv[1] > 1) {
        uv[0] = 1 - uv[0];  // mirror across u = 0.5
        uv[1] = 2 - uv[1];  // mirror across v = 1
    }
    return uv;
}